

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfVecAttribute.cpp
# Opt level: O1

void __thiscall
Imf_3_4::TypedAttribute<Imath_3_2::Vec3<double>_>::readValueFrom
          (TypedAttribute<Imath_3_2::Vec3<double>_> *this,IStream *is,int size,int version)

{
  Xdr::read<Imf_3_4::StreamIO,Imf_3_4::IStream>(is,&(this->_value).x);
  Xdr::read<Imf_3_4::StreamIO,Imf_3_4::IStream>(is,&(this->_value).y);
  Xdr::read<Imf_3_4::StreamIO,Imf_3_4::IStream>(is,&(this->_value).z);
  return;
}

Assistant:

IMF_EXPORT void
V3dAttribute::readValueFrom (
    OPENEXR_IMF_INTERNAL_NAMESPACE::IStream& is, int size, int version)
{
    Xdr::read<StreamIO> (is, _value.x);
    Xdr::read<StreamIO> (is, _value.y);
    Xdr::read<StreamIO> (is, _value.z);
}